

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O2

Type * anon_unknown.dwarf_f480::load_numeric(TypeNode *node,Factory *factory)

{
  NumericCategory NVar1;
  int iVar2;
  unsigned_long uVar3;
  Numeric *this;
  runtime_error *this_00;
  char *in_RCX;
  NumericCategory *pNVar4;
  allocator local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_a8,(_anonymous_namespace_ *)node->xml,(xmlNodePtr)0x10f10c,in_RCX);
  pNVar4 = &DAT_001137f8;
  while( true ) {
    if (*(undefined8 *)(pNVar4 + -2) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_88,"unrecognized XML node \'",&local_a9);
      std::operator+(&local_68,&local_88,local_a8._M_dataplus._M_p);
      std::operator+(&local_48,&local_68,"\'");
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = xmlStrcmp(local_a8._M_dataplus._M_p);
    if (iVar2 == 0) break;
    pNVar4 = pNVar4 + 4;
  }
  NVar1 = *pNVar4;
  std::__cxx11::string::~string((string *)&local_a8);
  uVar3 = getAttribute<unsigned_long>(node->xml,"size");
  this = (Numeric *)operator_new(0x48);
  Typelib::Numeric::Numeric(this,(string *)&node->name,uVar3,NVar1);
  Factory::insert(factory,node,(Type *)this);
  return (Type *)this;
}

Assistant:

Type const* load_numeric(TypeNode const& node, Factory& factory)
    {
        NumericCategory category = getCategoryFromNode
            ( numeric_categories
            , reinterpret_cast<xmlChar const*>(getAttribute<string>(node.xml, "category").c_str()) );
        size_t      size = getAttribute<size_t>(node.xml, "size");

        Type* type = new Numeric(node.name, size, category.type);
        factory.insert(node, type);
        return type;
    }